

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::MILSpec::Block::Block(Block *this,Arena *arena,bool is_message_owned)

{
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__MessageLite_004be5f0;
  google::protobuf::internal::InternalMetadata::InternalMetadata
            (&(this->super_MessageLite)._internal_metadata_,arena,is_message_owned);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Block_004b1750;
  (this->inputs_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->inputs_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->inputs_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->inputs_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->outputs_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->outputs_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->outputs_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->outputs_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->operations_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->operations_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->operations_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->operations_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->attributes_).map_.elements_.num_elements_ = 0;
  (this->attributes_).map_.elements_.num_buckets_ = 1;
  (this->attributes_).map_.elements_.seed_ = 0;
  (this->attributes_).map_.elements_.index_of_first_non_null_ = 1;
  (this->attributes_).map_.elements_.table_ =
       (void **)&google::protobuf::internal::kGlobalEmptyTable;
  (this->attributes_).map_.elements_.alloc_.arena_ = arena;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  return;
}

Assistant:

Block::Block(::PROTOBUF_NAMESPACE_ID::Arena* arena,
                         bool is_message_owned)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(arena, is_message_owned),
  inputs_(arena),
  outputs_(arena),
  operations_(arena),
  attributes_(arena) {
  SharedCtor();
  if (!is_message_owned) {
    RegisterArenaDtor(arena);
  }
  // @@protoc_insertion_point(arena_constructor:CoreML.Specification.MILSpec.Block)
}